

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O2

void tok_del_define(tokcxdef *ctx,char *sym,int len)

{
  uint uVar1;
  int iVar2;
  tokdfdef *ptVar3;
  tokdfdef *ptVar4;
  tokdfdef *__ptr;
  
  uVar1 = tokdfhsh(sym,len);
  ptVar4 = (tokdfdef *)(tokdfdef **)0x0;
  __ptr = (tokdfdef *)(ctx->tokcxdf + uVar1);
  do {
    do {
      ptVar3 = ptVar4;
      __ptr = __ptr->nxt;
      if (__ptr == (tokdfdef *)0x0) {
        return;
      }
      ptVar4 = __ptr;
    } while (__ptr->len != len);
    iVar2 = bcmp(__ptr->nm,sym,(long)len);
  } while (iVar2 != 0);
  ptVar4 = (tokdfdef *)(ctx->tokcxdf + uVar1);
  if (ptVar3 != (tokdfdef *)0x0) {
    ptVar4 = ptVar3;
  }
  ptVar4->nxt = __ptr->nxt;
  free(__ptr);
  return;
}

Assistant:

void tok_del_define(tokcxdef *ctx, char *sym, int len)
{
    int       hsh;
    tokdfdef *df;
    tokdfdef *prv;
    
    /* find the appropriate chain the hash table */
    hsh = tokdfhsh(sym, len);

    /* search the chain for this symbol */
    for (prv = 0, df = ctx->tokcxdf[hsh] ; df ; prv = df, df = df->nxt)
    {
        /* if this one matches, delete it */
        if (df->len == len && !memcmp(df->nm, sym, (size_t)len))
        {
            /* unlink it from the chain */
            if (prv)
                prv->nxt = df->nxt;
            else
                ctx->tokcxdf[hsh] = df->nxt;

            /* delete this symbol, and we're done */
            mchfre(df);
            break;
        }
    }
}